

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O1

int vx__plane_box_overlap(vx_vertex_t *normal,float d,vx_vertex_t *halfboxsize)

{
  int dim;
  uint uVar1;
  long lVar2;
  float fVar3;
  vx_vertex_t vmin;
  vx_vertex_t vmax;
  
  lVar2 = 0;
  do {
    fVar3 = (halfboxsize->field_0).v[lVar2];
    if ((normal->field_0).v[lVar2] <= 0.0) {
      vmin.field_0.v[lVar2] = fVar3;
      fVar3 = -fVar3;
    }
    else {
      vmin.field_0.v[lVar2] = -fVar3;
    }
    vmax.field_0.v[lVar2] = fVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  uVar1 = 0;
  if (vmin.field_0.v[2] * (normal->field_0).v[2] +
      vmin.field_0.v[0] * (normal->field_0).v[0] + vmin.field_0.v[1] * (normal->field_0).v[1] + d <=
      0.0) {
    uVar1 = (uint)(0.0 <= (normal->field_0).v[2] * vmax.field_0.v[2] +
                          (normal->field_0).v[0] * vmax.field_0.v[0] +
                          (normal->field_0).v[1] * vmax.field_0.v[1] + d);
  }
  return uVar1;
}

Assistant:

int vx__plane_box_overlap(vx_vertex_t* normal,
    float d,
    vx_vertex_t* halfboxsize)
{
    vx_vertex_t vmin, vmax;

    for (int dim = 0; dim <= 2; dim++) {
        if (normal->v[dim] > 0.0f) {
            vmin.v[dim] = -halfboxsize->v[dim];
            vmax.v[dim] = halfboxsize->v[dim];
        } else {
            vmin.v[dim] = halfboxsize->v[dim];
            vmax.v[dim] = -halfboxsize->v[dim];
        }
    }

    if (vx__vertex_dot(normal, &vmin) + d > 0.0f) {
        return false;
    }

    if (vx__vertex_dot(normal, &vmax) + d >= 0.0f) {
        return true;
    }

    return false;
}